

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

bool QUtil::is_long_long(char *str)

{
  bool bVar1;
  QUtil *this;
  int in_ECX;
  string s1;
  string local_30;
  
  this = (QUtil *)string_to_ll(str);
  int_to_string_abi_cxx11_(&local_30,this,0,in_ECX);
  bVar1 = std::operator==(str,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool
QUtil::is_long_long(char const* str)
{
    try {
        auto i1 = string_to_ll(str);
        std::string s1 = int_to_string(i1);
        return str == s1;
    } catch (std::exception&) {
        // overflow or other error
    }
    return false;
}